

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O1

bool __thiscall senjo::TestCommandHandle::Parse(TestCommandHandle *this,char *params)

{
  size_type sVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  Output *this_00;
  char *pcVar6;
  char *pcVar7;
  bool invalid;
  bool local_89;
  char *local_88;
  string *local_80;
  Output local_78;
  Output local_70;
  long local_68;
  _func_int *local_60 [2];
  uint64_t *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_88 = params;
  if ((Parse(char_const*)::argCount_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argCount_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argCount_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argCount_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argCount_abi_cxx11_,"count","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argCount_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argCount_abi_cxx11_);
  }
  if ((Parse(char_const*)::argDepth_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argDepth_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argDepth_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argDepth_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argDepth_abi_cxx11_,"depth","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argDepth_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argDepth_abi_cxx11_);
  }
  if ((Parse(char_const*)::argFile_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argFile_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argFile_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argFile_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argFile_abi_cxx11_,"file","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argFile_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argFile_abi_cxx11_);
  }
  if ((Parse(char_const*)::argGain_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argGain_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argGain_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argGain_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argGain_abi_cxx11_,"gain","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argGain_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argGain_abi_cxx11_);
  }
  if ((Parse(char_const*)::argNoClear_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argNoClear_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argNoClear_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argNoClear_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argNoClear_abi_cxx11_,"noclear","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argNoClear_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argNoClear_abi_cxx11_);
  }
  if ((Parse(char_const*)::argPrint_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argPrint_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argPrint_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argPrint_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argPrint_abi_cxx11_,"print","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argPrint_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argPrint_abi_cxx11_);
  }
  if ((Parse(char_const*)::argSkip_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argSkip_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argSkip_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argSkip_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argSkip_abi_cxx11_,"skip","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argSkip_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argSkip_abi_cxx11_);
  }
  if ((Parse(char_const*)::argTime_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argTime_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argTime_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argTime_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argTime_abi_cxx11_,"time","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argTime_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argTime_abi_cxx11_);
  }
  this->noClear = false;
  this->printBoard = false;
  this->maxTime = 0;
  local_80 = &this->fileName;
  this->maxCount = 0;
  this->maxDepth = 0;
  this->minGain = 0;
  this->skipCount = 0;
  std::__cxx11::string::_M_replace
            ((ulong)local_80,0,(char *)(this->fileName)._M_string_length,0x149148);
  local_89 = false;
  if (local_88 != (char *)0x0) {
    local_38 = &this->maxDepth;
    local_40 = &this->minGain;
    local_48 = &this->skipCount;
    local_50 = &this->maxTime;
    do {
      bVar5 = local_89;
      cVar2 = *local_88;
      pcVar7 = local_88;
      if (cVar2 != '\0') {
        pcVar7 = local_88 + 1;
        do {
          pcVar6 = pcVar7;
          iVar4 = isspace((int)cVar2);
          pcVar7 = pcVar6;
          if (iVar4 == 0) break;
          cVar2 = *pcVar6;
          pcVar7 = pcVar6 + 1;
          local_88 = pcVar6;
        } while (cVar2 != '\0');
        pcVar7 = pcVar7 + -1;
      }
      pcVar6 = local_88;
      sVar1 = Parse(char_const*)::argNoClear_abi_cxx11_._M_string_length;
      if (*pcVar7 == '\0') goto LAB_001399f2;
      if ((((Parse(char_const*)::argNoClear_abi_cxx11_._M_string_length == 0) ||
           (local_88 == (char *)0x0)) ||
          (iVar4 = strncmp(local_88,Parse(char_const*)::argNoClear_abi_cxx11_._M_dataplus._M_p,
                           Parse(char_const*)::argNoClear_abi_cxx11_._M_string_length), iVar4 != 0))
         || ((cVar2 = pcVar6[sVar1], cVar2 != '\0' && (iVar4 = isspace((int)cVar2), iVar4 == 0)))) {
        pcVar7 = local_88;
        sVar1 = Parse(char_const*)::argPrint_abi_cxx11_._M_string_length;
        if (((Parse(char_const*)::argPrint_abi_cxx11_._M_string_length == 0) ||
            ((local_88 == (char *)0x0 ||
             (iVar4 = strncmp(local_88,Parse(char_const*)::argPrint_abi_cxx11_._M_dataplus._M_p,
                              Parse(char_const*)::argPrint_abi_cxx11_._M_string_length), iVar4 != 0)
             ))) || ((cVar2 = pcVar7[sVar1], cVar2 != '\0' &&
                     (iVar4 = isspace((int)cVar2), iVar4 == 0)))) {
          bVar3 = NumberParam<int>(&Parse(char_const*)::argCount_abi_cxx11_,&this->maxCount,
                                   &local_88,&local_89);
          if ((((!bVar3) &&
               (bVar3 = NumberParam<int>(&Parse(char_const*)::argDepth_abi_cxx11_,local_38,&local_88
                                         ,&local_89), !bVar3)) &&
              (bVar3 = NumberParam<int>(&Parse(char_const*)::argGain_abi_cxx11_,local_40,&local_88,
                                        &local_89), !bVar3)) &&
             (((bVar3 = NumberParam<int>(&Parse(char_const*)::argSkip_abi_cxx11_,local_48,&local_88,
                                         &local_89), !bVar3 &&
               (bVar3 = NumberParam<unsigned_long>
                                  (&Parse(char_const*)::argTime_abi_cxx11_,local_50,&local_88,
                                   &local_89), !bVar3)) &&
              (bVar3 = StringParam(&Parse(char_const*)::argFile_abi_cxx11_,local_80,&local_88,
                                   &local_89), !bVar3)))) {
            Output::Output(&local_70,InfoPrefix);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Unexpected token: ",0x12);
            Output::operator<<(&local_70,&local_88);
            this_00 = &local_70;
            goto LAB_00139a63;
          }
        }
        else {
          local_88 = pcVar7 + sVar1;
          cVar2 = *local_88;
          while (cVar2 != '\0') {
            pcVar7 = local_88 + 1;
            iVar4 = isspace((int)cVar2);
            if (iVar4 == 0) break;
            local_88 = pcVar7;
            cVar2 = *pcVar7;
          }
          this->printBoard = true;
        }
      }
      else {
        local_88 = pcVar6 + sVar1;
        cVar2 = *local_88;
        while (cVar2 != '\0') {
          pcVar7 = local_88 + 1;
          iVar4 = isspace((int)cVar2);
          if (iVar4 == 0) break;
          local_88 = pcVar7;
          cVar2 = *pcVar7;
        }
        this->noClear = true;
      }
      bVar5 = local_89;
      if ((local_89 != false) || (local_88 == (char *)0x0)) goto LAB_001399f2;
    } while( true );
  }
LAB_00139a6c:
  if ((this->fileName)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)local_80);
  }
  return true;
LAB_001399f2:
  if ((bVar5 & 1) != 0) {
    Output::Output(&local_78,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    (*(this->super_BackgroundCommand)._vptr_BackgroundCommand[3])(&local_70,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_70._vptr_Output,local_68);
    if (local_70._vptr_Output != local_60) {
      operator_delete(local_70._vptr_Output,(ulong)(local_60[0] + 1));
    }
    this_00 = &local_78;
LAB_00139a63:
    Output::~Output(this_00);
    return false;
  }
  goto LAB_00139a6c;
}

Assistant:

bool TestCommandHandle::Parse(const char* params)
{
  static const std::string argCount   = "count";
  static const std::string argDepth   = "depth";
  static const std::string argFile    = "file";
  static const std::string argGain    = "gain";
  static const std::string argNoClear = "noclear";
  static const std::string argPrint   = "print";
  static const std::string argSkip    = "skip";
  static const std::string argTime    = "time";

  noClear    = false;
  printBoard = false;
  maxCount   = 0;
  maxDepth   = 0;
  minGain    = 0;
  skipCount  = 0;
  maxTime    = 0;
  fileName   = "";

  bool invalid = false;
  while (!invalid && params && *NextWord(params)) {
    if (HasParam(argNoClear,  noClear,    params) ||
        HasParam(argPrint,    printBoard, params) ||
        NumberParam(argCount, maxCount,   params, invalid) ||
        NumberParam(argDepth, maxDepth,   params, invalid) ||
        NumberParam(argGain,  minGain,    params, invalid) ||
        NumberParam(argSkip,  skipCount,  params, invalid) ||
        NumberParam(argTime,  maxTime,    params, invalid) ||
        StringParam(argFile,  fileName,   params, invalid))
    {
      continue;
    }
    Output() << "Unexpected token: " << params;
    return false;
  }
  if (invalid) {
    Output() << "usage: " << Usage();
    return false;
  }

  if (fileName.empty()) {
    fileName = _TEST_FILE;
  }

  return true;
}